

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

bool __thiscall google::protobuf::io::Printer::Next(Printer *this)

{
  int iVar1;
  void *void_buffer;
  char *local_20;
  
  do {
    iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                      (this->output_,&local_20,&this->buffer_size_);
    if (SUB41(iVar1,0) == false) {
      this->failed_ = true;
      return false;
    }
    this->buffer_ = local_20;
  } while (this->buffer_size_ == 0);
  return SUB41(iVar1,0);
}

Assistant:

bool Printer::Next() {
  do {
    void* void_buffer;
    if (!output_->Next(&void_buffer, &buffer_size_)) {
      failed_ = true;
      return false;
    }
    buffer_ = reinterpret_cast<char*>(void_buffer);
  } while (buffer_size_ == 0);
  return true;
}